

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeRealtimeTest_TestInternalResizeDown_Test::TestBody
          (ResizeRealtimeTest_TestInternalResizeDown_Test *this)

{
  EncoderTest *pEVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  FrameInfo *info;
  pointer pFVar5;
  int iVar6;
  pointer *__ptr;
  uint uVar7;
  SEARCH_METHODS *pSVar8;
  uint uVar9;
  bool bVar10;
  AssertHelper local_a8;
  AssertHelper local_a0;
  int resize_down_count;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"niklas_640_480_30.yuv",(allocator *)&local_a8);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x280,0x1e0,0x1e,1,0,400);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w = 0x280;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h = 0x1e0;
  (this->super_ResizeRealtimeTest).change_bitrate_ = false;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_resize_mode = 3;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_target_bitrate = 0x96;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x500;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x500;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      pEVar1 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar4 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar4 == false) {
      uVar9 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w;
      uVar7 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h;
      resize_down_count = 0;
      iVar6 = 0;
      for (pFVar5 = (this->super_ResizeRealtimeTest).frame_info_list_.
                    super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar5 != (this->super_ResizeRealtimeTest).frame_info_list_.
                    super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
        uVar2 = pFVar5->w;
        uVar3 = pFVar5->h;
        if ((uVar3 != uVar7 || uVar2 != uVar9) &&
           (bVar4 = uVar2 < uVar9, bVar10 = uVar3 < uVar7, uVar9 = uVar2, uVar7 = uVar3,
           bVar10 && bVar4)) {
          iVar6 = iVar6 + 1;
          resize_down_count = iVar6;
        }
      }
      local_a8.data_._0_4_ = 1;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)&gtest_fatal_failure_checker,"resize_down_count","1",&resize_down_count
                 ,(int *)&local_a8);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a8);
        std::operator<<((ostream *)(CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 0x10),
                        "Resizing should occur.");
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x38a,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        local_a8.data_._0_4_ = 0;
        local_a0.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                   "GetMismatchFrames()",(uint *)&local_a8,(uint *)&local_a0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_a8);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar8 = "";
          }
          else {
            pSVar8 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x38b,(char *)pSVar8);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
          }
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_005ef5f3;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x378,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005ef5f3:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDown) {
  ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30, 1,
                                       0, 400);
  cfg_.g_w = 640;
  cfg_.g_h = 480;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 150;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      // Verify that resize down occurs.
      if (info.w < last_w && info.h < last_h) {
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
  }

  // Verify that we get at lease 1 resize down event in this test.
  ASSERT_GE(resize_down_count, 1) << "Resizing should occur.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}